

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  int iVar1;
  ZSTD_compressedBlockState_t *pZVar2;
  U32 *pUVar3;
  ulong in_RSI;
  ulong in_RDI;
  ZSTD_cpuid_t cpuid;
  ZSTD_CCtx *cctx;
  ZSTD_cwksp ws;
  undefined1 in_stack_ffffffffffffff88 [16];
  void *in_stack_ffffffffffffff98;
  ZSTD_cwksp *in_stack_ffffffffffffffa0;
  ZSTD_cwksp *in_stack_ffffffffffffffa8;
  ZSTD_CCtx *local_8;
  
  if (in_RSI < 0x1479) {
    local_8 = (ZSTD_CCtx *)0x0;
  }
  else if ((in_RDI & 7) == 0) {
    ZSTD_cwksp_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                    in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._4_4_);
    local_8 = (ZSTD_CCtx *)
              ZSTD_cwksp_reserve_object(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0)
    ;
    if (local_8 == (ZSTD_CCtx *)0x0) {
      local_8 = (ZSTD_CCtx *)0x0;
    }
    else {
      memset(local_8,0,0x1478);
      ZSTD_cwksp_move(in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._0_8_);
      local_8->staticSize = in_RSI;
      iVar1 = ZSTD_cwksp_check_available
                        (in_stack_ffffffffffffff88._8_8_,in_stack_ffffffffffffff88._0_8_);
      if (iVar1 == 0) {
        local_8 = (ZSTD_CCtx *)0x0;
      }
      else {
        pZVar2 = (ZSTD_compressedBlockState_t *)
                 ZSTD_cwksp_reserve_object
                           (in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
        (local_8->blockState).prevCBlock = pZVar2;
        pZVar2 = (ZSTD_compressedBlockState_t *)
                 ZSTD_cwksp_reserve_object
                           (in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
        (local_8->blockState).nextCBlock = pZVar2;
        pUVar3 = (U32 *)ZSTD_cwksp_reserve_object
                                  (in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
        local_8->entropyWorkspace = pUVar3;
        cpuid = ZSTD_cpuid();
        iVar1 = ZSTD_cpuid_bmi2(cpuid);
        local_8->bmi2 = iVar1;
      }
    }
  }
  else {
    local_8 = (ZSTD_CCtx *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}